

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto_writer.cc
# Opt level: O2

ProtoWriter * __thiscall
google::protobuf::util::converter::ProtoWriter::RenderPrimitiveField
          (ProtoWriter *this,Field *field,Type *type,DataPiece *data)

{
  bool bVar1;
  TypeInfo *pTVar2;
  CodedOutputStream *pCVar3;
  int iVar4;
  int iVar5;
  ProtoElement *pPVar6;
  stringpiece_ssize_type sVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint *puVar8;
  float *pfVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  double *pdVar11;
  unsigned_long *puVar12;
  bool *pbVar13;
  long *plVar14;
  int *piVar15;
  string *psVar16;
  undefined4 extraout_var_01;
  ProtoElement *pPVar17;
  undefined4 extraout_var_02;
  StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  pointer __p_2;
  pointer __p;
  StringPiece SVar18;
  StringPiece local_120;
  StringPiece local_110;
  StringPiece local_100;
  StringPiece local_f0;
  StringPiece local_e0;
  Type *local_d0;
  undefined1 local_c8 [8];
  Status status;
  StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> s;
  string local_50 [32];
  
  local_d0 = type;
  Status::Status((Status *)local_c8);
  pPVar17 = (this->element_)._M_t.
            super___uniq_ptr_impl<google::protobuf::util::converter::ProtoWriter::ProtoElement,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
            ._M_t.
            super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
            .
            super__Head_base<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_false>
            ._M_head_impl;
  if (pPVar17->proto3_ == false) {
    pPVar6 = (ProtoElement *)operator_new(0xa8);
    (this->element_)._M_t.
    super___uniq_ptr_impl<google::protobuf::util::converter::ProtoWriter::ProtoElement,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
    ._M_t.
    super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
    .super__Head_base<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_false>.
    _M_head_impl = (ProtoElement *)0x0;
    ProtoElement::ProtoElement(pPVar6,pPVar17,field,local_d0,false);
    pPVar17 = (this->element_)._M_t.
              super___uniq_ptr_impl<google::protobuf::util::converter::ProtoWriter::ProtoElement,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
              ._M_t.
              super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
              .
              super__Head_base<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_false>
              ._M_head_impl;
    (this->element_)._M_t.
    super___uniq_ptr_impl<google::protobuf::util::converter::ProtoWriter::ProtoElement,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
    ._M_t.
    super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
    .super__Head_base<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_false>.
    _M_head_impl = pPVar6;
    if (pPVar17 != (ProtoElement *)0x0) {
      (**(code **)((long)(pPVar17->super_BaseElement)._vptr_BaseElement + 8))();
    }
  }
  switch(field->kind_) {
  case 0:
  case 0xb:
    pPVar17 = (this->element_)._M_t.
              super___uniq_ptr_impl<google::protobuf::util::converter::ProtoWriter::ProtoElement,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
              ._M_t.
              super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
              .
              super__Head_base<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_false>
              ._M_head_impl;
    if (pPVar17->proto3_ == true) {
      pPVar6 = (ProtoElement *)operator_new(0xa8);
      (this->element_)._M_t.
      super___uniq_ptr_impl<google::protobuf::util::converter::ProtoWriter::ProtoElement,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
      ._M_t.
      super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
      .super__Head_base<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_false>.
      _M_head_impl = (ProtoElement *)0x0;
      ProtoElement::ProtoElement(pPVar6,pPVar17,field,local_d0,false);
      pPVar17 = (this->element_)._M_t.
                super___uniq_ptr_impl<google::protobuf::util::converter::ProtoWriter::ProtoElement,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
                ._M_t.
                super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
                .
                super__Head_base<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_false>
                ._M_head_impl;
      (this->element_)._M_t.
      super___uniq_ptr_impl<google::protobuf::util::converter::ProtoWriter::ProtoElement,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
      ._M_t.
      super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
      .super__Head_base<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_false>.
      _M_head_impl = pPVar6;
      if (pPVar17 != (ProtoElement *)0x0) {
        (**(code **)((long)(pPVar17->super_BaseElement)._vptr_BaseElement + 8))();
      }
    }
    psVar16 = (field->type_url_).ptr_;
    if (psVar16->_M_string_length == 0) {
      psVar16 = Field_Kind_Name<google::protobuf::Field_Kind>(field->kind_);
    }
    StringPiece::StringPiece<std::allocator<char>>(&local_120,psVar16);
    StringPiece::StringPiece(&local_110,"");
    DataPiece::ValueAsStringOrDefault_abi_cxx11_
              ((string *)((long)&status.error_message_.field_2 + 8),data,local_110);
    SVar18.ptr_._4_4_ = status.error_message_.field_2._12_4_;
    SVar18.ptr_._0_4_ = status.error_message_.field_2._8_4_;
    sVar7 = StringPiece::CheckedSsizeTFromSizeT(s.status_._0_8_);
    SVar18.length_ = sVar7;
    InvalidValue(this,local_120,SVar18);
    std::__cxx11::string::~string((string *)(status.error_message_.field_2._M_local_buf + 8));
    iVar5 = (*(this->super_StructuredObjectWriter).super_ObjectWriter._vptr_ObjectWriter[0x11])
                      (this);
    pPVar17 = ProtoElement::pop((ProtoElement *)CONCAT44(extraout_var,iVar5));
    goto LAB_00331f32;
  case 1:
    iVar5 = field->number_;
    pCVar3 = (this->stream_)._M_t.
             super___uniq_ptr_impl<google::protobuf::io::CodedOutputStream,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
             ._M_t.
             super__Tuple_impl<0UL,_google::protobuf::io::CodedOutputStream_*,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
             .super__Head_base<0UL,_google::protobuf::io::CodedOutputStream_*,_false>._M_head_impl;
    DataPiece::ToDouble((StatusOr<double> *)((long)&status.error_message_.field_2 + 8),data);
    if (status.error_message_.field_2._8_4_ == 0) {
      pdVar11 = StatusOr<double>::value
                          ((StatusOr<double> *)((long)&status.error_message_.field_2 + 8));
      protobuf::internal::WireFormatLite::WriteDouble(iVar5,*pdVar11,pCVar3);
    }
    Status::Status((Status *)((long)&s.value_.field_2 + 8),
                   (Status *)((long)&status.error_message_.field_2 + 8));
    std::__cxx11::string::~string((string *)&s);
    Status::operator=((Status *)local_c8,(Status *)((long)&s.value_.field_2 + 8));
    break;
  case 2:
    iVar5 = field->number_;
    pCVar3 = (this->stream_)._M_t.
             super___uniq_ptr_impl<google::protobuf::io::CodedOutputStream,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
             ._M_t.
             super__Tuple_impl<0UL,_google::protobuf::io::CodedOutputStream_*,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
             .super__Head_base<0UL,_google::protobuf::io::CodedOutputStream_*,_false>._M_head_impl;
    DataPiece::ToFloat((StatusOr<float> *)((long)&status.error_message_.field_2 + 8),data);
    if (status.error_message_.field_2._8_4_ == 0) {
      pfVar9 = StatusOr<float>::value((StatusOr<float> *)((long)&status.error_message_.field_2 + 8))
      ;
      protobuf::internal::WireFormatLite::WriteFloat(iVar5,*pfVar9,pCVar3);
    }
    Status::Status((Status *)((long)&s.value_.field_2 + 8),
                   (Status *)((long)&status.error_message_.field_2 + 8));
    std::__cxx11::string::~string((string *)&s);
    Status::operator=((Status *)local_c8,(Status *)((long)&s.value_.field_2 + 8));
    break;
  case 3:
    iVar5 = field->number_;
    pCVar3 = (this->stream_)._M_t.
             super___uniq_ptr_impl<google::protobuf::io::CodedOutputStream,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
             ._M_t.
             super__Tuple_impl<0UL,_google::protobuf::io::CodedOutputStream_*,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
             .super__Head_base<0UL,_google::protobuf::io::CodedOutputStream_*,_false>._M_head_impl;
    DataPiece::ToInt64((StatusOr<long> *)((long)&status.error_message_.field_2 + 8),data);
    if (status.error_message_.field_2._8_4_ == 0) {
      plVar14 = StatusOr<long>::value((StatusOr<long> *)((long)&status.error_message_.field_2 + 8));
      protobuf::internal::WireFormatLite::WriteInt64(iVar5,*plVar14,pCVar3);
    }
    Status::Status((Status *)((long)&s.value_.field_2 + 8),
                   (Status *)((long)&status.error_message_.field_2 + 8));
    std::__cxx11::string::~string((string *)&s);
    Status::operator=((Status *)local_c8,(Status *)((long)&s.value_.field_2 + 8));
    break;
  case 4:
    iVar5 = field->number_;
    pCVar3 = (this->stream_)._M_t.
             super___uniq_ptr_impl<google::protobuf::io::CodedOutputStream,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
             ._M_t.
             super__Tuple_impl<0UL,_google::protobuf::io::CodedOutputStream_*,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
             .super__Head_base<0UL,_google::protobuf::io::CodedOutputStream_*,_false>._M_head_impl;
    DataPiece::ToUint64((StatusOr<unsigned_long> *)((long)&status.error_message_.field_2 + 8),data);
    if (status.error_message_.field_2._8_4_ == 0) {
      puVar12 = StatusOr<unsigned_long>::value
                          ((StatusOr<unsigned_long> *)((long)&status.error_message_.field_2 + 8));
      protobuf::internal::WireFormatLite::WriteUInt64(iVar5,*puVar12,pCVar3);
    }
    Status::Status((Status *)((long)&s.value_.field_2 + 8),
                   (Status *)((long)&status.error_message_.field_2 + 8));
    std::__cxx11::string::~string((string *)&s);
    Status::operator=((Status *)local_c8,(Status *)((long)&s.value_.field_2 + 8));
    break;
  case 5:
    iVar5 = field->number_;
    pCVar3 = (this->stream_)._M_t.
             super___uniq_ptr_impl<google::protobuf::io::CodedOutputStream,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
             ._M_t.
             super__Tuple_impl<0UL,_google::protobuf::io::CodedOutputStream_*,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
             .super__Head_base<0UL,_google::protobuf::io::CodedOutputStream_*,_false>._M_head_impl;
    DataPiece::ToInt32((StatusOr<int> *)((long)&status.error_message_.field_2 + 8),data);
    if (status.error_message_.field_2._8_4_ == 0) {
      piVar15 = StatusOr<int>::value((StatusOr<int> *)((long)&status.error_message_.field_2 + 8));
      protobuf::internal::WireFormatLite::WriteInt32(iVar5,*piVar15,pCVar3);
    }
    Status::Status((Status *)((long)&s.value_.field_2 + 8),
                   (Status *)((long)&status.error_message_.field_2 + 8));
    std::__cxx11::string::~string((string *)&s);
    Status::operator=((Status *)local_c8,(Status *)((long)&s.value_.field_2 + 8));
    break;
  case 6:
    iVar5 = field->number_;
    pCVar3 = (this->stream_)._M_t.
             super___uniq_ptr_impl<google::protobuf::io::CodedOutputStream,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
             ._M_t.
             super__Tuple_impl<0UL,_google::protobuf::io::CodedOutputStream_*,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
             .super__Head_base<0UL,_google::protobuf::io::CodedOutputStream_*,_false>._M_head_impl;
    DataPiece::ToUint64((StatusOr<unsigned_long> *)((long)&status.error_message_.field_2 + 8),data);
    if (status.error_message_.field_2._8_4_ == 0) {
      puVar12 = StatusOr<unsigned_long>::value
                          ((StatusOr<unsigned_long> *)((long)&status.error_message_.field_2 + 8));
      protobuf::internal::WireFormatLite::WriteFixed64(iVar5,*puVar12,pCVar3);
    }
    Status::Status((Status *)((long)&s.value_.field_2 + 8),
                   (Status *)((long)&status.error_message_.field_2 + 8));
    std::__cxx11::string::~string((string *)&s);
    Status::operator=((Status *)local_c8,(Status *)((long)&s.value_.field_2 + 8));
    break;
  case 7:
    iVar5 = field->number_;
    pCVar3 = (this->stream_)._M_t.
             super___uniq_ptr_impl<google::protobuf::io::CodedOutputStream,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
             ._M_t.
             super__Tuple_impl<0UL,_google::protobuf::io::CodedOutputStream_*,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
             .super__Head_base<0UL,_google::protobuf::io::CodedOutputStream_*,_false>._M_head_impl;
    DataPiece::ToUint32((StatusOr<unsigned_int> *)((long)&status.error_message_.field_2 + 8),data);
    if (status.error_message_.field_2._8_4_ == 0) {
      puVar8 = StatusOr<unsigned_int>::value
                         ((StatusOr<unsigned_int> *)((long)&status.error_message_.field_2 + 8));
      protobuf::internal::WireFormatLite::WriteFixed32(iVar5,*puVar8,pCVar3);
    }
    Status::Status((Status *)((long)&s.value_.field_2 + 8),
                   (Status *)((long)&status.error_message_.field_2 + 8));
    std::__cxx11::string::~string((string *)&s);
    Status::operator=((Status *)local_c8,(Status *)((long)&s.value_.field_2 + 8));
    break;
  case 8:
    iVar5 = field->number_;
    pCVar3 = (this->stream_)._M_t.
             super___uniq_ptr_impl<google::protobuf::io::CodedOutputStream,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
             ._M_t.
             super__Tuple_impl<0UL,_google::protobuf::io::CodedOutputStream_*,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
             .super__Head_base<0UL,_google::protobuf::io::CodedOutputStream_*,_false>._M_head_impl;
    DataPiece::ToBool((StatusOr<bool> *)((long)&status.error_message_.field_2 + 8),data);
    if (status.error_message_.field_2._8_4_ == 0) {
      pbVar13 = StatusOr<bool>::value((StatusOr<bool> *)((long)&status.error_message_.field_2 + 8));
      protobuf::internal::WireFormatLite::WriteBool(iVar5,*pbVar13,pCVar3);
    }
    Status::Status((Status *)((long)&s.value_.field_2 + 8),
                   (Status *)((long)&status.error_message_.field_2 + 8));
    std::__cxx11::string::~string((string *)&s);
    Status::operator=((Status *)local_c8,(Status *)((long)&s.value_.field_2 + 8));
    break;
  case 9:
    iVar5 = field->number_;
    pCVar3 = (this->stream_)._M_t.
             super___uniq_ptr_impl<google::protobuf::io::CodedOutputStream,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
             ._M_t.
             super__Tuple_impl<0UL,_google::protobuf::io::CodedOutputStream_*,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
             .super__Head_base<0UL,_google::protobuf::io::CodedOutputStream_*,_false>._M_head_impl;
    DataPiece::ToString_abi_cxx11_
              ((StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)((long)&status.error_message_.field_2 + 8),data);
    if (status.error_message_.field_2._8_4_ == 0) {
      pbVar10 = StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::value((StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)((long)&status.error_message_.field_2 + 8));
      protobuf::internal::WireFormatLite::WriteString(iVar5,pbVar10,pCVar3);
    }
    Status::Status((Status *)((long)&s.value_.field_2 + 8),
                   (Status *)((long)&status.error_message_.field_2 + 8));
    StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~StatusOr((StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)((long)&status.error_message_.field_2 + 8));
    Status::operator=((Status *)local_c8,(Status *)((long)&s.value_.field_2 + 8));
    break;
  default:
    DataPiece::ToString_abi_cxx11_
              ((StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)((long)&status.error_message_.field_2 + 8),data);
    pbVar10 = StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::value((StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)((long)&status.error_message_.field_2 + 8));
    StringPiece::StringPiece<std::allocator<char>>(&local_f0,pbVar10);
    Status::Status((Status *)((long)&s.value_.field_2 + 8),INVALID_ARGUMENT,local_f0);
    Status::operator=((Status *)local_c8,(Status *)((long)&s.value_.field_2 + 8));
    std::__cxx11::string::~string(local_50);
    StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~StatusOr((StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)((long)&status.error_message_.field_2 + 8));
    goto LAB_00331e6e;
  case 0xc:
    iVar5 = field->number_;
    pCVar3 = (this->stream_)._M_t.
             super___uniq_ptr_impl<google::protobuf::io::CodedOutputStream,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
             ._M_t.
             super__Tuple_impl<0UL,_google::protobuf::io::CodedOutputStream_*,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
             .super__Head_base<0UL,_google::protobuf::io::CodedOutputStream_*,_false>._M_head_impl;
    DataPiece::ToBytes_abi_cxx11_
              ((StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)((long)&status.error_message_.field_2 + 8),data);
    if (status.error_message_.field_2._8_4_ == 0) {
      pbVar10 = StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::ValueOrDie((StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)((long)&status.error_message_.field_2 + 8));
      protobuf::internal::WireFormatLite::WriteBytes(iVar5,pbVar10,pCVar3);
    }
    Status::Status((Status *)((long)&s.value_.field_2 + 8),
                   (Status *)((long)&status.error_message_.field_2 + 8));
    StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~StatusOr((StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)((long)&status.error_message_.field_2 + 8));
    Status::operator=((Status *)local_c8,(Status *)((long)&s.value_.field_2 + 8));
    break;
  case 0xd:
    iVar5 = field->number_;
    pCVar3 = (this->stream_)._M_t.
             super___uniq_ptr_impl<google::protobuf::io::CodedOutputStream,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
             ._M_t.
             super__Tuple_impl<0UL,_google::protobuf::io::CodedOutputStream_*,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
             .super__Head_base<0UL,_google::protobuf::io::CodedOutputStream_*,_false>._M_head_impl;
    DataPiece::ToUint32((StatusOr<unsigned_int> *)((long)&status.error_message_.field_2 + 8),data);
    if (status.error_message_.field_2._8_4_ == 0) {
      puVar8 = StatusOr<unsigned_int>::value
                         ((StatusOr<unsigned_int> *)((long)&status.error_message_.field_2 + 8));
      protobuf::internal::WireFormatLite::WriteUInt32(iVar5,*puVar8,pCVar3);
    }
    Status::Status((Status *)((long)&s.value_.field_2 + 8),
                   (Status *)((long)&status.error_message_.field_2 + 8));
    std::__cxx11::string::~string((string *)&s);
    Status::operator=((Status *)local_c8,(Status *)((long)&s.value_.field_2 + 8));
    break;
  case 0xe:
    iVar5 = field->number_;
    pTVar2 = this->typeinfo_;
    StringPiece::StringPiece<std::allocator<char>>(&local_100,(field->type_url_).ptr_);
    iVar4 = (*pTVar2->_vptr_TypeInfo[4])(pTVar2,local_100.ptr_,local_100.length_);
    WriteEnum((Status *)((long)&status.error_message_.field_2 + 8),iVar5,data,
              (Enum *)CONCAT44(extraout_var_00,iVar4),
              (this->stream_)._M_t.
              super___uniq_ptr_impl<google::protobuf::io::CodedOutputStream,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
              ._M_t.
              super__Tuple_impl<0UL,_google::protobuf::io::CodedOutputStream_*,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
              .super__Head_base<0UL,_google::protobuf::io::CodedOutputStream_*,_false>._M_head_impl,
              this->use_lower_camel_for_enums_,this->case_insensitive_enum_parsing_,
              this->ignore_unknown_enum_values_);
    Status::operator=((Status *)local_c8,(Status *)((long)&status.error_message_.field_2 + 8));
    this_00 = &s;
    goto LAB_00331e69;
  case 0xf:
    iVar5 = field->number_;
    pCVar3 = (this->stream_)._M_t.
             super___uniq_ptr_impl<google::protobuf::io::CodedOutputStream,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
             ._M_t.
             super__Tuple_impl<0UL,_google::protobuf::io::CodedOutputStream_*,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
             .super__Head_base<0UL,_google::protobuf::io::CodedOutputStream_*,_false>._M_head_impl;
    DataPiece::ToInt32((StatusOr<int> *)((long)&status.error_message_.field_2 + 8),data);
    if (status.error_message_.field_2._8_4_ == 0) {
      piVar15 = StatusOr<int>::value((StatusOr<int> *)((long)&status.error_message_.field_2 + 8));
      protobuf::internal::WireFormatLite::WriteSFixed32(iVar5,*piVar15,pCVar3);
    }
    Status::Status((Status *)((long)&s.value_.field_2 + 8),
                   (Status *)((long)&status.error_message_.field_2 + 8));
    std::__cxx11::string::~string((string *)&s);
    Status::operator=((Status *)local_c8,(Status *)((long)&s.value_.field_2 + 8));
    break;
  case 0x10:
    iVar5 = field->number_;
    pCVar3 = (this->stream_)._M_t.
             super___uniq_ptr_impl<google::protobuf::io::CodedOutputStream,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
             ._M_t.
             super__Tuple_impl<0UL,_google::protobuf::io::CodedOutputStream_*,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
             .super__Head_base<0UL,_google::protobuf::io::CodedOutputStream_*,_false>._M_head_impl;
    DataPiece::ToInt64((StatusOr<long> *)((long)&status.error_message_.field_2 + 8),data);
    if (status.error_message_.field_2._8_4_ == 0) {
      plVar14 = StatusOr<long>::value((StatusOr<long> *)((long)&status.error_message_.field_2 + 8));
      protobuf::internal::WireFormatLite::WriteSFixed64(iVar5,*plVar14,pCVar3);
    }
    Status::Status((Status *)((long)&s.value_.field_2 + 8),
                   (Status *)((long)&status.error_message_.field_2 + 8));
    std::__cxx11::string::~string((string *)&s);
    Status::operator=((Status *)local_c8,(Status *)((long)&s.value_.field_2 + 8));
    break;
  case 0x11:
    iVar5 = field->number_;
    pCVar3 = (this->stream_)._M_t.
             super___uniq_ptr_impl<google::protobuf::io::CodedOutputStream,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
             ._M_t.
             super__Tuple_impl<0UL,_google::protobuf::io::CodedOutputStream_*,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
             .super__Head_base<0UL,_google::protobuf::io::CodedOutputStream_*,_false>._M_head_impl;
    DataPiece::ToInt32((StatusOr<int> *)((long)&status.error_message_.field_2 + 8),data);
    if (status.error_message_.field_2._8_4_ == 0) {
      piVar15 = StatusOr<int>::value((StatusOr<int> *)((long)&status.error_message_.field_2 + 8));
      protobuf::internal::WireFormatLite::WriteSInt32(iVar5,*piVar15,pCVar3);
    }
    Status::Status((Status *)((long)&s.value_.field_2 + 8),
                   (Status *)((long)&status.error_message_.field_2 + 8));
    std::__cxx11::string::~string((string *)&s);
    Status::operator=((Status *)local_c8,(Status *)((long)&s.value_.field_2 + 8));
    break;
  case 0x12:
    iVar5 = field->number_;
    pCVar3 = (this->stream_)._M_t.
             super___uniq_ptr_impl<google::protobuf::io::CodedOutputStream,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
             ._M_t.
             super__Tuple_impl<0UL,_google::protobuf::io::CodedOutputStream_*,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
             .super__Head_base<0UL,_google::protobuf::io::CodedOutputStream_*,_false>._M_head_impl;
    DataPiece::ToInt64((StatusOr<long> *)((long)&status.error_message_.field_2 + 8),data);
    if (status.error_message_.field_2._8_4_ == 0) {
      plVar14 = StatusOr<long>::value((StatusOr<long> *)((long)&status.error_message_.field_2 + 8));
      protobuf::internal::WireFormatLite::WriteSInt64(iVar5,*plVar14,pCVar3);
    }
    Status::Status((Status *)((long)&s.value_.field_2 + 8),
                   (Status *)((long)&status.error_message_.field_2 + 8));
    std::__cxx11::string::~string((string *)&s);
    Status::operator=((Status *)local_c8,(Status *)((long)&s.value_.field_2 + 8));
  }
  this_00 = (StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_50;
LAB_00331e69:
  std::__cxx11::string::~string((string *)this_00);
LAB_00331e6e:
  pPVar17 = (this->element_)._M_t.
            super___uniq_ptr_impl<google::protobuf::util::converter::ProtoWriter::ProtoElement,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
            ._M_t.
            super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
            .
            super__Head_base<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_false>
            ._M_head_impl;
  bVar1 = pPVar17->proto3_;
  if (local_c8._0_4_ == OK) {
    if (bVar1 != false) goto LAB_00331f45;
    iVar5 = (*(this->super_StructuredObjectWriter).super_ObjectWriter._vptr_ObjectWriter[0x11])
                      (this);
    pPVar17 = ProtoElement::pop((ProtoElement *)CONCAT44(extraout_var_02,iVar5));
  }
  else {
    if (bVar1 != false) {
      pPVar6 = (ProtoElement *)operator_new(0xa8);
      (this->element_)._M_t.
      super___uniq_ptr_impl<google::protobuf::util::converter::ProtoWriter::ProtoElement,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
      ._M_t.
      super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
      .super__Head_base<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_false>.
      _M_head_impl = (ProtoElement *)0x0;
      ProtoElement::ProtoElement(pPVar6,pPVar17,field,local_d0,false);
      pPVar17 = (this->element_)._M_t.
                super___uniq_ptr_impl<google::protobuf::util::converter::ProtoWriter::ProtoElement,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
                ._M_t.
                super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
                .
                super__Head_base<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_false>
                ._M_head_impl;
      (this->element_)._M_t.
      super___uniq_ptr_impl<google::protobuf::util::converter::ProtoWriter::ProtoElement,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
      ._M_t.
      super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
      .super__Head_base<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_false>.
      _M_head_impl = pPVar6;
      if (pPVar17 != (ProtoElement *)0x0) {
        (**(code **)((long)(pPVar17->super_BaseElement)._vptr_BaseElement + 8))();
      }
    }
    psVar16 = Field_Kind_Name<google::protobuf::Field_Kind>(field->kind_);
    StringPiece::StringPiece<std::allocator<char>>(&local_e0,psVar16);
    SVar18 = Status::message((Status *)local_c8);
    InvalidValue(this,local_e0,SVar18);
    iVar5 = (*(this->super_StructuredObjectWriter).super_ObjectWriter._vptr_ObjectWriter[0x11])
                      (this);
    pPVar17 = ProtoElement::pop((ProtoElement *)CONCAT44(extraout_var_01,iVar5));
  }
LAB_00331f32:
  pPVar6 = (this->element_)._M_t.
           super___uniq_ptr_impl<google::protobuf::util::converter::ProtoWriter::ProtoElement,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
           .
           super__Head_base<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_false>
           ._M_head_impl;
  (this->element_)._M_t.
  super___uniq_ptr_impl<google::protobuf::util::converter::ProtoWriter::ProtoElement,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
  .super__Head_base<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_false>.
  _M_head_impl = pPVar17;
  if (pPVar6 != (ProtoElement *)0x0) {
    (**(code **)((long)(pPVar6->super_BaseElement)._vptr_BaseElement + 8))();
  }
LAB_00331f45:
  std::__cxx11::string::~string((string *)&status);
  return this;
}

Assistant:

ProtoWriter* ProtoWriter::RenderPrimitiveField(
    const google::protobuf::Field& field, const google::protobuf::Type& type,
    const DataPiece& data) {
  Status status;

  // Pushing a ProtoElement and then pop it off at the end for 2 purposes:
  // error location reporting and required field accounting.
  //
  // For proto3, since there is no required field tracking, we only need to push
  // ProtoElement for error cases.
  if (!element_->proto3()) {
    element_.reset(new ProtoElement(element_.release(), &field, type, false));
  }

  if (field.kind() == google::protobuf::Field::TYPE_UNKNOWN ||
      field.kind() == google::protobuf::Field::TYPE_MESSAGE) {
    // Push a ProtoElement for location reporting purposes.
    if (element_->proto3()) {
      element_.reset(new ProtoElement(element_.release(), &field, type, false));
    }
    InvalidValue(field.type_url().empty()
                     ? google::protobuf::Field_Kind_Name(field.kind())
                     : field.type_url(),
                 data.ValueAsStringOrDefault(""));
    element_.reset(element()->pop());
    return this;
  }

  switch (field.kind()) {
    case google::protobuf::Field::TYPE_INT32: {
      status = WriteInt32(field.number(), data, stream_.get());
      break;
    }
    case google::protobuf::Field::TYPE_SFIXED32: {
      status = WriteSFixed32(field.number(), data, stream_.get());
      break;
    }
    case google::protobuf::Field::TYPE_SINT32: {
      status = WriteSInt32(field.number(), data, stream_.get());
      break;
    }
    case google::protobuf::Field::TYPE_FIXED32: {
      status = WriteFixed32(field.number(), data, stream_.get());
      break;
    }
    case google::protobuf::Field::TYPE_UINT32: {
      status = WriteUInt32(field.number(), data, stream_.get());
      break;
    }
    case google::protobuf::Field::TYPE_INT64: {
      status = WriteInt64(field.number(), data, stream_.get());
      break;
    }
    case google::protobuf::Field::TYPE_SFIXED64: {
      status = WriteSFixed64(field.number(), data, stream_.get());
      break;
    }
    case google::protobuf::Field::TYPE_SINT64: {
      status = WriteSInt64(field.number(), data, stream_.get());
      break;
    }
    case google::protobuf::Field::TYPE_FIXED64: {
      status = WriteFixed64(field.number(), data, stream_.get());
      break;
    }
    case google::protobuf::Field::TYPE_UINT64: {
      status = WriteUInt64(field.number(), data, stream_.get());
      break;
    }
    case google::protobuf::Field::TYPE_DOUBLE: {
      status = WriteDouble(field.number(), data, stream_.get());
      break;
    }
    case google::protobuf::Field::TYPE_FLOAT: {
      status = WriteFloat(field.number(), data, stream_.get());
      break;
    }
    case google::protobuf::Field::TYPE_BOOL: {
      status = WriteBool(field.number(), data, stream_.get());
      break;
    }
    case google::protobuf::Field::TYPE_BYTES: {
      status = WriteBytes(field.number(), data, stream_.get());
      break;
    }
    case google::protobuf::Field::TYPE_STRING: {
      status = WriteString(field.number(), data, stream_.get());
      break;
    }
    case google::protobuf::Field::TYPE_ENUM: {
      status = WriteEnum(
          field.number(), data, typeinfo_->GetEnumByTypeUrl(field.type_url()),
          stream_.get(), use_lower_camel_for_enums_,
          case_insensitive_enum_parsing_, ignore_unknown_enum_values_);
      break;
    }
    default:  // TYPE_GROUP or TYPE_MESSAGE
      status =
          Status(util::error::INVALID_ARGUMENT, data.ToString().value());
  }

  if (!status.ok()) {
    // Push a ProtoElement for location reporting purposes.
    if (element_->proto3()) {
      element_.reset(new ProtoElement(element_.release(), &field, type, false));
    }
    InvalidValue(google::protobuf::Field_Kind_Name(field.kind()),
                 status.message());
    element_.reset(element()->pop());
    return this;
  }

  if (!element_->proto3()) element_.reset(element()->pop());

  return this;
}